

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::MaskConstancyCase::iterate(MaskConstancyCase *this)

{
  size_t this_00;
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  MessageBuilder *pMVar6;
  TestContext *pTVar7;
  float x_;
  float fVar8;
  float y_;
  float fVar9;
  byte local_fd1;
  float local_f74;
  float local_f68;
  float local_f64;
  byte local_f41;
  byte local_f22;
  byte local_f21;
  char *local_ec8;
  char *local_ec0;
  char *local_eb8;
  MessageBuilder local_eb0;
  undefined4 local_d2c;
  MessageBuilder local_d28;
  RGBA local_ba8;
  int local_ba4;
  int local_ba0;
  int x;
  int y;
  allocator<char> local_b71;
  string local_b70;
  LogImage local_b50;
  Vec4 local_abc;
  Vec4 local_aac;
  Vec4 local_a9c;
  Vec4 local_a8c;
  Vector<float,_2> local_a7c;
  Vector<float,_2> local_a74;
  Vector<float,_2> local_a6c;
  Vector<float,_2> local_a64;
  Vec4 local_a5c;
  Vec4 local_a4c;
  Vec4 local_a3c;
  Vec4 local_a2c;
  Vector<float,_2> local_a1c;
  Vector<float,_2> local_a14;
  Vector<float,_2> local_a0c;
  Vector<float,_2> local_a04;
  uint local_9fc;
  undefined1 local_9f5;
  GLbitfield maskMask;
  int iStack_9f0;
  bool isFinalWord;
  GLbitfield mask;
  int wordNdx;
  GLbitfield finalWordMask;
  GLbitfield finalWordBits;
  int wordCount;
  float value;
  Vec4 alpha1;
  Vec4 alpha0;
  Vec4 baseRed;
  Vec4 baseGreen;
  float y1;
  float y0;
  float x1;
  float x0;
  int col;
  int row;
  int numQuadRowsCols;
  char *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  MessageBuilder local_950;
  MessageBuilder local_7d0;
  MessageBuilder local_650;
  MessageBuilder local_4d0;
  MessageBuilder local_350;
  MessageBuilder local_1d0;
  undefined1 local_40 [8];
  Surface renderedImg;
  TestLog *log;
  Functions *gl;
  MaskConstancyCase *this_local;
  long lVar5;
  
  pRVar4 = Context::getRenderContext
                     ((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  renderedImg.m_pixels.m_cap =
       (size_t)tcu::TestContext::getLog
                         ((this->super_DefaultFBOMultisampleCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
  iVar1 = (this->super_DefaultFBOMultisampleCase).m_viewportSize;
  tcu::Surface::Surface((Surface *)local_40,iVar1,iVar1);
  DefaultFBOMultisampleCase::randomizeViewport(&this->super_DefaultFBOMultisampleCase);
  tcu::TestLog::operator<<
            (&local_1d0,(TestLog *)renderedImg.m_pixels.m_cap,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [24])"Clearing color to black");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  (**(code **)(lVar5 + 0x1c0))(0,0);
  (**(code **)(lVar5 + 0x188))(0x4000);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x2f5);
  if (((this->super_DefaultFBOMultisampleCase).field_0xb1 & 1) != 0) {
    (**(code **)(lVar5 + 0x5e0))(0x809e);
    (**(code **)(lVar5 + 0x238))(1,1,1,0);
    dVar2 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar2,"enable GL_SAMPLE_ALPHA_TO_COVERAGE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x2fb);
    tcu::TestLog::operator<<
              (&local_350,(TestLog *)renderedImg.m_pixels.m_cap,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_350,(char (*) [39])"GL_SAMPLE_ALPHA_TO_COVERAGE is enabled");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_350);
    tcu::TestLog::operator<<
              (&local_4d0,(TestLog *)renderedImg.m_pixels.m_cap,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_4d0,(char (*) [38])"Color mask is TRUE, TRUE, TRUE, FALSE");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4d0);
  }
  if (((this->super_DefaultFBOMultisampleCase).field_0xb2 & 1) != 0) {
    (**(code **)(lVar5 + 0x5e0))(0x80a0);
    dVar2 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar2,"enable GL_SAMPLE_COVERAGE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x304);
    tcu::TestLog::operator<<
              (&local_650,(TestLog *)renderedImg.m_pixels.m_cap,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_650,(char (*) [30])"GL_SAMPLE_COVERAGE is enabled");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_650);
  }
  if (((this->super_DefaultFBOMultisampleCase).field_0xb4 & 1) != 0) {
    (**(code **)(lVar5 + 0x5e0))(0x8e51);
    dVar2 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar2,"enable GL_SAMPLE_MASK",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x30c);
    tcu::TestLog::operator<<
              (&local_7d0,(TestLog *)renderedImg.m_pixels.m_cap,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_7d0,(char (*) [26])"GL_SAMPLE_MASK is enabled");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_7d0);
  }
  tcu::TestLog::operator<<
            (&local_950,(TestLog *)renderedImg.m_pixels.m_cap,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_950,
                      (char (*) [80])
                      "Drawing several green quads, each fully overlapped by a red quad with the same "
                     );
  local_958 = "";
  if (((this->super_DefaultFBOMultisampleCase).field_0xb1 & 1) != 0) {
    local_958 = "alpha";
  }
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_958);
  local_f21 = 0;
  if (((this->super_DefaultFBOMultisampleCase).field_0xb1 & 1) != 0) {
    local_f22 = 1;
    if (((this->super_DefaultFBOMultisampleCase).field_0xb2 & 1) == 0) {
      local_f22 = (this->super_DefaultFBOMultisampleCase).field_0xb4;
    }
    local_f21 = local_f22;
  }
  local_960 = "";
  if ((local_f21 & 1) != 0) {
    local_960 = " and ";
  }
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_960);
  local_968 = "";
  if (((this->super_DefaultFBOMultisampleCase).field_0xb3 & 1) != 0) {
    local_968 = "inverted ";
  }
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_968);
  local_970 = "";
  if (((this->super_DefaultFBOMultisampleCase).field_0xb2 & 1) != 0) {
    local_970 = "sample coverage";
  }
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_970);
  local_f41 = 0;
  if (((this->super_DefaultFBOMultisampleCase).field_0xb2 & 1) != 0) {
    local_f41 = (this->super_DefaultFBOMultisampleCase).field_0xb4;
  }
  local_978 = "";
  if ((local_f41 & 1) != 0) {
    local_978 = " and ";
  }
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_978);
  _row = "";
  if (((this->super_DefaultFBOMultisampleCase).field_0xb4 & 1) != 0) {
    _row = "sample mask";
  }
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char **)&row);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [8])0xf4aa67);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_950);
  iVar1 = (this->super_DefaultFBOMultisampleCase).m_numSamples * 4;
  for (x0 = 0.0; (int)x0 < iVar1; x0 = (float)((int)x0 + 1)) {
    for (x1 = 0.0; (int)x1 < iVar1; x1 = (float)((int)x1 + 1)) {
      x_ = (float)(int)x1 / (float)iVar1 + (float)(int)x1 / (float)iVar1 + -1.0;
      fVar8 = (float)((int)x1 + 1) / (float)iVar1;
      fVar8 = fVar8 + fVar8 + -1.0;
      y_ = (float)(int)x0 / (float)iVar1 + (float)(int)x0 / (float)iVar1 + -1.0;
      fVar9 = (float)((int)x0 + 1) / (float)iVar1;
      fVar9 = fVar9 + fVar9 + -1.0;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(baseRed.m_data + 2),0.0,1.0,0.0,0.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(alpha0.m_data + 2),1.0,0.0,0.0,0.0);
      if (((this->super_DefaultFBOMultisampleCase).field_0xb1 & 1) == 0) {
        local_f64 = 1.0;
      }
      else {
        local_f64 = (float)(int)x1 / (float)(iVar1 + -1);
      }
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(alpha1.m_data + 2),0.0,0.0,0.0,local_f64);
      if (((this->super_DefaultFBOMultisampleCase).field_0xb1 & 1) == 0) {
        local_f68 = 1.0;
      }
      else {
        local_f68 = (float)(int)x0 / (float)(iVar1 + -1);
      }
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&wordCount,0.0,0.0,0.0,local_f68);
      if (((this->super_DefaultFBOMultisampleCase).field_0xb2 & 1) != 0) {
        finalWordBits =
             (GLbitfield)((float)((int)x0 * iVar1 + (int)x1) / (float)(iVar1 * iVar1 + -1));
        local_f74 = (float)finalWordBits;
        if (((this->super_DefaultFBOMultisampleCase).field_0xb3 & 1) != 0) {
          local_f74 = 1.0 - (float)finalWordBits;
        }
        (**(code **)(lVar5 + 0x1250))
                  (local_f74,(this->super_DefaultFBOMultisampleCase).field_0xb3 & 1);
        dVar2 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar2,"glSampleCoverage",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                        ,0x32f);
      }
      if (((this->super_DefaultFBOMultisampleCase).field_0xb4 & 1) != 0) {
        finalWordMask =
             getEffectiveSampleMaskWordCount
                       ((this->super_DefaultFBOMultisampleCase).m_numSamples + -1);
        wordNdx = (this->super_DefaultFBOMultisampleCase).m_numSamples +
                  (((this->super_DefaultFBOMultisampleCase).m_numSamples + -1) / 0x20) * -0x20;
        mask = deBitMask32(0,wordNdx);
        for (iStack_9f0 = 0; iStack_9f0 < (int)finalWordMask; iStack_9f0 = iStack_9f0 + 1) {
          iVar3 = (this->super_DefaultFBOMultisampleCase).m_numSamples;
          maskMask = deUint32Hash((int)x1 << ((byte)((uint)(iVar3 - (iVar3 >> 0x1f)) >> 1) & 0x1f) ^
                                  (uint)x0);
          local_9f5 = iStack_9f0 + 1U == finalWordMask;
          local_9fc = mask;
          if (!(bool)local_9f5) {
            local_9fc = 0xffffffff;
          }
          (**(code **)(lVar5 + 0x1258))(iStack_9f0,maskMask & local_9fc);
          dVar2 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar2,"glSampleMaski",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                          ,0x33f);
        }
      }
      tcu::Vector<float,_2>::Vector(&local_a04,x_,y_);
      tcu::Vector<float,_2>::Vector(&local_a0c,fVar8,y_);
      tcu::Vector<float,_2>::Vector(&local_a14,x_,fVar9);
      tcu::Vector<float,_2>::Vector(&local_a1c,fVar8,fVar9);
      tcu::operator+((tcu *)&local_a2c,(Vector<float,_4> *)(baseRed.m_data + 2),
                     (Vector<float,_4> *)(alpha1.m_data + 2));
      tcu::operator+((tcu *)&local_a3c,(Vector<float,_4> *)(baseRed.m_data + 2),
                     (Vector<float,_4> *)&wordCount);
      tcu::operator+((tcu *)&local_a4c,(Vector<float,_4> *)(baseRed.m_data + 2),
                     (Vector<float,_4> *)(alpha1.m_data + 2));
      tcu::operator+((tcu *)&local_a5c,(Vector<float,_4> *)(baseRed.m_data + 2),
                     (Vector<float,_4> *)&wordCount);
      DefaultFBOMultisampleCase::renderQuad
                (&this->super_DefaultFBOMultisampleCase,&local_a04,&local_a0c,&local_a14,&local_a1c,
                 &local_a2c,&local_a3c,&local_a4c,&local_a5c);
      tcu::Vector<float,_2>::Vector(&local_a64,x_,y_);
      tcu::Vector<float,_2>::Vector(&local_a6c,fVar8,y_);
      tcu::Vector<float,_2>::Vector(&local_a74,x_,fVar9);
      tcu::Vector<float,_2>::Vector(&local_a7c,fVar8,fVar9);
      tcu::operator+((tcu *)&local_a8c,(Vector<float,_4> *)(alpha0.m_data + 2),
                     (Vector<float,_4> *)(alpha1.m_data + 2));
      tcu::operator+((tcu *)&local_a9c,(Vector<float,_4> *)(alpha0.m_data + 2),
                     (Vector<float,_4> *)&wordCount);
      tcu::operator+((tcu *)&local_aac,(Vector<float,_4> *)(alpha0.m_data + 2),
                     (Vector<float,_4> *)(alpha1.m_data + 2));
      tcu::operator+((tcu *)&local_abc,(Vector<float,_4> *)(alpha0.m_data + 2),
                     (Vector<float,_4> *)&wordCount);
      DefaultFBOMultisampleCase::renderQuad
                (&this->super_DefaultFBOMultisampleCase,&local_a64,&local_a6c,&local_a74,&local_a7c,
                 &local_a8c,&local_a9c,&local_aac,&local_abc);
    }
  }
  DefaultFBOMultisampleCase::readImage(&this->super_DefaultFBOMultisampleCase,(Surface *)local_40);
  this_00 = renderedImg.m_pixels.m_cap;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b70,"RenderedImage",&local_b71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&y,"Rendered image",(allocator<char> *)((long)&x + 3));
  tcu::LogImage::LogImage
            (&local_b50,&local_b70,(string *)&y,(Surface *)local_40,QP_IMAGE_COMPRESSION_MODE_PNG);
  tcu::TestLog::operator<<((TestLog *)this_00,&local_b50);
  tcu::LogImage::~LogImage(&local_b50);
  std::__cxx11::string::~string((string *)&y);
  std::allocator<char>::~allocator((allocator<char> *)((long)&x + 3));
  std::__cxx11::string::~string((string *)&local_b70);
  std::allocator<char>::~allocator(&local_b71);
  local_ba0 = 0;
  do {
    iVar1 = local_ba0;
    iVar3 = tcu::Surface::getHeight((Surface *)local_40);
    if (iVar3 <= iVar1) {
      tcu::TestLog::operator<<
                (&local_eb0,(TestLog *)renderedImg.m_pixels.m_cap,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_eb0,
                          (char (*) [88])
                          "Success: Coverage mask appears to be constant at a given pixel coordinate with a given "
                         );
      local_eb8 = "";
      if (((this->super_DefaultFBOMultisampleCase).field_0xb1 & 1) != 0) {
        local_eb8 = "alpha";
      }
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_eb8);
      local_fd1 = 0;
      if (((this->super_DefaultFBOMultisampleCase).field_0xb1 & 1) != 0) {
        local_fd1 = (this->super_DefaultFBOMultisampleCase).field_0xb2;
      }
      local_ec0 = "";
      if ((local_fd1 & 1) != 0) {
        local_ec0 = " and ";
      }
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_ec0);
      local_ec8 = "";
      if (((this->super_DefaultFBOMultisampleCase).field_0xb2 & 1) != 0) {
        local_ec8 = "coverage value";
      }
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_ec8);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_eb0);
      pTVar7 = Context::getTestContext
                         ((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context);
      tcu::TestContext::setTestResult(pTVar7,QP_TEST_RESULT_PASS,"Passed");
LAB_0084da70:
      local_d2c = 1;
      tcu::Surface::~Surface((Surface *)local_40);
      return STOP;
    }
    for (local_ba4 = 0; iVar1 = local_ba4, iVar3 = tcu::Surface::getWidth((Surface *)local_40),
        iVar1 < iVar3; local_ba4 = local_ba4 + 1) {
      local_ba8 = tcu::Surface::getPixel((Surface *)local_40,local_ba4,local_ba0);
      iVar1 = tcu::RGBA::getGreen(&local_ba8);
      if (0 < iVar1) {
        tcu::TestLog::operator<<
                  (&local_d28,(TestLog *)renderedImg.m_pixels.m_cap,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_d28,
                            (char (*) [103])
                            "Failure: Non-zero green color component detected - should have been completely overwritten by red quad"
                           );
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_d28);
        pTVar7 = Context::getTestContext
                           ((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context);
        tcu::TestContext::setTestResult(pTVar7,QP_TEST_RESULT_FAIL,"Failed");
        goto LAB_0084da70;
      }
    }
    local_ba0 = local_ba0 + 1;
  } while( true );
}

Assistant:

MaskConstancyCase::IterateResult MaskConstancyCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	TestLog&				log				= m_testCtx.getLog();
	tcu::Surface			renderedImg		(m_viewportSize, m_viewportSize);

	randomizeViewport();

	log << TestLog::Message << "Clearing color to black" << TestLog::EndMessage;
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

	if (m_isAlphaToCoverageCase)
	{
		gl.enable(GL_SAMPLE_ALPHA_TO_COVERAGE);
		gl.colorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_FALSE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "enable GL_SAMPLE_ALPHA_TO_COVERAGE");

		log << TestLog::Message << "GL_SAMPLE_ALPHA_TO_COVERAGE is enabled" << TestLog::EndMessage;
		log << TestLog::Message << "Color mask is TRUE, TRUE, TRUE, FALSE" << TestLog::EndMessage;
	}

	if (m_isSampleCoverageCase)
	{
		gl.enable(GL_SAMPLE_COVERAGE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "enable GL_SAMPLE_COVERAGE");

		log << TestLog::Message << "GL_SAMPLE_COVERAGE is enabled" << TestLog::EndMessage;
	}

	if (m_isSampleMaskCase)
	{
		gl.enable(GL_SAMPLE_MASK);
		GLU_EXPECT_NO_ERROR(gl.getError(), "enable GL_SAMPLE_MASK");

		log << TestLog::Message << "GL_SAMPLE_MASK is enabled" << TestLog::EndMessage;
	}

	log << TestLog::Message
		<< "Drawing several green quads, each fully overlapped by a red quad with the same "
		<< (m_isAlphaToCoverageCase ? "alpha" : "")
		<< (m_isAlphaToCoverageCase && (m_isSampleCoverageCase || m_isSampleMaskCase) ? " and " : "")
		<< (m_isInvertedSampleCoverageCase ? "inverted " : "")
		<< (m_isSampleCoverageCase ? "sample coverage" : "")
		<< (m_isSampleCoverageCase && m_isSampleMaskCase ? " and " : "")
		<< (m_isSampleMaskCase ? "sample mask" : "")
		<< " values"
		<< TestLog::EndMessage;

	const int numQuadRowsCols = m_numSamples*4;

	for (int row = 0; row < numQuadRowsCols; row++)
	{
		for (int col = 0; col < numQuadRowsCols; col++)
		{
			float		x0			= (float)(col+0) / (float)numQuadRowsCols * 2.0f - 1.0f;
			float		x1			= (float)(col+1) / (float)numQuadRowsCols * 2.0f - 1.0f;
			float		y0			= (float)(row+0) / (float)numQuadRowsCols * 2.0f - 1.0f;
			float		y1			= (float)(row+1) / (float)numQuadRowsCols * 2.0f - 1.0f;
			const Vec4	baseGreen	(0.0f, 1.0f, 0.0f, 0.0f);
			const Vec4	baseRed		(1.0f, 0.0f, 0.0f, 0.0f);
			Vec4		alpha0		(0.0f, 0.0f, 0.0f, m_isAlphaToCoverageCase ? (float)col / (float)(numQuadRowsCols-1) : 1.0f);
			Vec4		alpha1		(0.0f, 0.0f, 0.0f, m_isAlphaToCoverageCase ? (float)row / (float)(numQuadRowsCols-1) : 1.0f);

			if (m_isSampleCoverageCase)
			{
				float value = (float)(row*numQuadRowsCols + col) / (float)(numQuadRowsCols*numQuadRowsCols-1);
				gl.sampleCoverage(m_isInvertedSampleCoverageCase ? 1.0f - value : value, m_isInvertedSampleCoverageCase ? GL_TRUE : GL_FALSE);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glSampleCoverage");
			}

			if (m_isSampleMaskCase)
			{
				const int			wordCount		= getEffectiveSampleMaskWordCount(m_numSamples - 1);
				const GLbitfield	finalWordBits	= m_numSamples - 32 * ((m_numSamples-1) / 32);
				const GLbitfield	finalWordMask	= (GLbitfield)deBitMask32(0, (int)finalWordBits);

				for (int wordNdx = 0; wordNdx < wordCount; ++wordNdx)
				{
					const GLbitfield	mask		= (GLbitfield)deUint32Hash((col << (m_numSamples / 2)) ^ row);
					const bool			isFinalWord	= (wordNdx + 1) == wordCount;
					const GLbitfield	maskMask	= (isFinalWord) ? (finalWordMask) : (0xFFFFFFFFUL); // maskMask prevents setting coverage bits higher than sample count

					gl.sampleMaski(wordNdx, mask & maskMask);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glSampleMaski");
				}
			}

			renderQuad(Vec2(x0, y0), Vec2(x1, y0), Vec2(x0, y1), Vec2(x1, y1), baseGreen + alpha0,	baseGreen + alpha1,	baseGreen + alpha0,	baseGreen + alpha1);
			renderQuad(Vec2(x0, y0), Vec2(x1, y0), Vec2(x0, y1), Vec2(x1, y1), baseRed + alpha0,	baseRed + alpha1,	baseRed + alpha0,	baseRed + alpha1);
		}
	}

	readImage(renderedImg);

	log << TestLog::Image("RenderedImage", "Rendered image", renderedImg, QP_IMAGE_COMPRESSION_MODE_PNG);

	for (int y = 0; y < renderedImg.getHeight(); y++)
	for (int x = 0; x < renderedImg.getWidth(); x++)
	{
		if (renderedImg.getPixel(x, y).getGreen() > 0)
		{
			log << TestLog::Message << "Failure: Non-zero green color component detected - should have been completely overwritten by red quad" << TestLog::EndMessage;
			m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Failed");
			return STOP;
		}
	}

	log << TestLog::Message
		<< "Success: Coverage mask appears to be constant at a given pixel coordinate with a given "
		<< (m_isAlphaToCoverageCase ? "alpha" : "")
		<< (m_isAlphaToCoverageCase && m_isSampleCoverageCase ? " and " : "")
		<< (m_isSampleCoverageCase ? "coverage value" : "")
		<< TestLog::EndMessage;

	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Passed");

	return STOP;
}